

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int http_parse_body(http_s *h)

{
  int iVar1;
  FIOBJ FVar2;
  size_t sVar3;
  FIOBJ FVar4;
  bool bVar5;
  fio_str_info_s local_e0;
  size_t local_c8;
  size_t cons;
  http_fio_mime_s p;
  FIOBJ key;
  FIOBJ tmp_1;
  size_t local_50;
  char *local_48;
  FIOBJ local_40;
  FIOBJ tmp;
  fio_str_info_s content_type;
  FIOBJ ct;
  http_s *h_local;
  
  if (h->body == 0) {
    h_local._4_4_ = -1;
  }
  else {
    if (http_parse_body::content_type_hash == 0) {
      http_parse_body::content_type_hash = fiobj_hash_string("content-type",0xc);
    }
    content_type.data = (char *)fiobj_hash_get2(h->headers,http_parse_body::content_type_hash);
    fiobj_obj2cstr((fio_str_info_s *)&tmp,(FIOBJ)content_type.data);
    if (content_type.capa < 0x10) {
      h_local._4_4_ = -1;
    }
    else if ((content_type.capa < 0x21) ||
            (iVar1 = strncasecmp("application/x-www-form-urlencoded",(char *)content_type.len,0x21),
            iVar1 != 0)) {
      if ((content_type.capa < 0x10) ||
         (iVar1 = strncasecmp("application/json",(char *)content_type.len,0x10), iVar1 != 0)) {
        memset(&cons,0,0x58);
        p.p._16_8_ = h;
        iVar1 = http_mime_parser_init
                          ((http_mime_parser_s *)&cons,(char *)content_type.len,content_type.capa);
        if (iVar1 == 0) {
          if (h->params == 0) {
            FVar2 = fiobj_hash_new();
            h->params = FVar2;
          }
          do {
            local_c8 = http_mime_parse((http_mime_parser_s *)&cons,(void *)p.buffer.len,
                                       p.buffer.capa);
            p.buffer.data = p.buffer.data + local_c8;
            fiobj_data_pread(&local_e0,h->body,(intptr_t)p.buffer.data,0x1000);
            p.h = (http_s *)local_e0.capa;
            p.buffer.capa = local_e0.len;
            p.buffer.len = (size_t)local_e0.data;
            bVar5 = false;
            if ((local_e0.data != (char *)0x0) && (bVar5 = false, p.p.boundary_len._1_1_ == '\0')) {
              bVar5 = p.p.boundary_len._2_1_ == '\0';
            }
          } while (bVar5);
          fiobj_free(p.partial_length);
          h_local._4_4_ = 0;
        }
        else {
          h_local._4_4_ = -1;
        }
      }
      else {
        fiobj_obj2cstr((fio_str_info_s *)&tmp_1,h->body);
        tmp = tmp_1;
        content_type.capa = local_50;
        content_type.len = (size_t)local_48;
        if (h->params == 0) {
          sVar3 = fiobj_json2obj(&h->params,local_48,local_50);
          if (sVar3 == 0) {
            h_local._4_4_ = -1;
          }
          else {
            sVar3 = fiobj_type_is(h->params,FIOBJ_T_HASH);
            if (sVar3 == 0) {
              FVar2 = h->params;
              p.partial_name = fiobj_str_new("JSON",4);
              FVar4 = fiobj_hash_new2(4);
              h->params = FVar4;
              fiobj_hash_set(h->params,p.partial_name,FVar2);
              fiobj_free(p.partial_name);
              h_local._4_4_ = 0;
            }
            else {
              h_local._4_4_ = 0;
            }
          }
        }
        else {
          h_local._4_4_ = -1;
        }
      }
    }
    else {
      if (h->params == 0) {
        FVar2 = fiobj_hash_new();
        h->params = FVar2;
      }
      local_40 = h->query;
      h->query = h->body;
      http_parse_query(h);
      h->query = local_40;
      h_local._4_4_ = 0;
    }
  }
  return h_local._4_4_;
}

Assistant:

int http_parse_body(http_s *h) {
  static uint64_t content_type_hash;
  if (!h->body)
    return -1;
  if (!content_type_hash)
    content_type_hash = fiobj_hash_string("content-type", 12);
  FIOBJ ct = fiobj_hash_get2(h->headers, content_type_hash);
  fio_str_info_s content_type = fiobj_obj2cstr(ct);
  if (content_type.len < 16)
    return -1;
  if (content_type.len >= 33 &&
      !strncasecmp("application/x-www-form-urlencoded", content_type.data,
                   33)) {
    if (!h->params)
      h->params = fiobj_hash_new();
    FIOBJ tmp = h->query;
    h->query = h->body;
    http_parse_query(h);
    h->query = tmp;
    return 0;
  }
  if (content_type.len >= 16 &&
      !strncasecmp("application/json", content_type.data, 16)) {
    content_type = fiobj_obj2cstr(h->body);
    if (h->params)
      return -1;
    if (fiobj_json2obj(&h->params, content_type.data, content_type.len) == 0)
      return -1;
    if (FIOBJ_TYPE_IS(h->params, FIOBJ_T_HASH))
      return 0;
    FIOBJ tmp = h->params;
    FIOBJ key = fiobj_str_new("JSON", 4);
    h->params = fiobj_hash_new2(4);
    fiobj_hash_set(h->params, key, tmp);
    fiobj_free(key);
    return 0;
  }

  http_fio_mime_s p = {.h = h};
  if (http_mime_parser_init(&p.p, content_type.data, content_type.len))
    return -1;
  if (!h->params)
    h->params = fiobj_hash_new();

  do {
    size_t cons = http_mime_parse(&p.p, p.buffer.data, p.buffer.len);
    p.pos += cons;
    p.buffer = fiobj_data_pread(h->body, p.pos, 4096);
  } while (p.buffer.data && !p.p.done && !p.p.error);
  fiobj_free(p.partial_name);
  p.partial_name = FIOBJ_INVALID;
  return 0;
}